

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_client.cc
# Opt level: O0

bool bssl::tls13_process_new_session_ticket(SSL *ssl,SSLMessage *msg)

{
  _func_int_SSL_ptr_SSL_SESSION_ptr *p_Var1;
  bool bVar2;
  int iVar3;
  pointer psVar4;
  pointer psVar5;
  undefined1 local_38 [8];
  UniquePtr<SSL_SESSION> session;
  CBS body;
  SSLMessage *msg_local;
  SSL *ssl_local;
  
  if (ssl->s3->write_shutdown == ssl_shutdown_none) {
    session._M_t.super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)(msg->body).data;
    tls13_create_session_with_ticket((SSL *)local_38,(CBS *)ssl);
    bVar2 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_38);
    if (bVar2) {
      psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->session_ctx);
      if ((psVar4->session_cache_mode & 1U) != 0) {
        psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->(&ssl->session_ctx)
        ;
        if (psVar4->new_session_cb != (_func_int_SSL_ptr_SSL_SESSION_ptr *)0x0) {
          psVar4 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::operator->
                             (&ssl->session_ctx);
          p_Var1 = psVar4->new_session_cb;
          psVar5 = std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_38);
          iVar3 = (*p_Var1)(ssl,psVar5);
          if (iVar3 != 0) {
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_38);
          }
        }
      }
      ssl_local._7_1_ = true;
    }
    else {
      ssl_local._7_1_ = false;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_38);
  }
  else {
    ssl_local._7_1_ = true;
  }
  return ssl_local._7_1_;
}

Assistant:

bool tls13_process_new_session_ticket(SSL *ssl, const SSLMessage &msg) {
  if (ssl->s3->write_shutdown != ssl_shutdown_none) {
    // Ignore tickets on shutdown. Callers tend to indiscriminately call
    // |SSL_shutdown| before destroying an |SSL|, at which point calling the new
    // session callback may be confusing.
    return true;
  }

  CBS body = msg.body;
  UniquePtr<SSL_SESSION> session = tls13_create_session_with_ticket(ssl, &body);
  if (!session) {
    return false;
  }

  if ((ssl->session_ctx->session_cache_mode & SSL_SESS_CACHE_CLIENT) &&
      ssl->session_ctx->new_session_cb != NULL &&
      ssl->session_ctx->new_session_cb(ssl, session.get())) {
    // |new_session_cb|'s return value signals that it took ownership.
    session.release();
  }

  return true;
}